

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

void word_restore(t_word *wp,t_template *template,int argc,t_atom *argv)

{
  int iVar1;
  t_pd local_48;
  t_symbol *s;
  t_float f;
  int type;
  t_dataslot *datatypes;
  int nitems;
  int i;
  t_atom *argv_local;
  int argc_local;
  t_template *template_local;
  t_word *wp_local;
  
  iVar1 = template->t_n;
  _f = template->t_vec;
  _nitems = argv;
  argv_local._4_4_ = argc;
  template_local = (t_template *)wp;
  for (datatypes._4_4_ = 0; datatypes._4_4_ < iVar1; datatypes._4_4_ = datatypes._4_4_ + 1) {
    if (_f->ds_type == 0) {
      if (argv_local._4_4_ == 0) {
        s._0_4_ = 0.0;
      }
      else {
        s._0_4_ = atom_getfloat(_nitems);
        _nitems = _nitems + 1;
        argv_local._4_4_ = argv_local._4_4_ + -1;
      }
      *(t_float *)&template_local->t_pdobj = s._0_4_;
    }
    else if (_f->ds_type == 1) {
      if (argv_local._4_4_ == 0) {
        local_48 = (t_pd)&s_;
      }
      else {
        local_48 = (t_pd)atom_getsymbol(_nitems);
        _nitems = _nitems + 1;
        argv_local._4_4_ = argv_local._4_4_ + -1;
      }
      template_local->t_pdobj = local_48;
    }
    _f = _f + 1;
    template_local = (t_template *)&template_local->t_list;
  }
  if (argv_local._4_4_ != 0) {
    post("warning: word_restore: extra arguments");
  }
  return;
}

Assistant:

void word_restore(t_word *wp, t_template *template,
    int argc, t_atom *argv)
{
    int i, nitems = template->t_n;
    t_dataslot *datatypes = template->t_vec;
    for (i = 0; i < nitems; i++, datatypes++, wp++)
    {
        int type = datatypes->ds_type;
        if (type == DT_FLOAT)
        {
            t_float f;
            if (argc)
            {
                f =  atom_getfloat(argv);
                argv++, argc--;
            }
            else f = 0;
            wp->w_float = f;
        }
        else if (type == DT_SYMBOL)
        {
            t_symbol *s;
            if (argc)
            {
                s =  atom_getsymbol(argv);
                argv++, argc--;
            }
            else s = &s_;
            wp->w_symbol = s;
        }
    }
    if (argc)
        post("warning: word_restore: extra arguments");
}